

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

GCstr * lj_lib_checkstr(lua_State *L,int narg)

{
  uint uVar1;
  TValue *pTVar2;
  cTValue *o;
  GCstr *pGVar3;
  long lVar4;
  
  pTVar2 = L->base;
  lVar4 = (long)narg;
  o = pTVar2 + lVar4 + -1;
  if (o < L->top) {
    uVar1 = *(uint *)((long)pTVar2 + lVar4 * 8 + -4);
    if (uVar1 == 0xfffffffb) {
      pGVar3 = (GCstr *)(ulong)(o->u32).lo;
    }
    else {
      if (0xfffeffff < uVar1) goto LAB_0013ef2a;
      pGVar3 = lj_strfmt_number(L,o);
      pTVar2[lVar4 + -1].u32.lo = (uint32_t)pGVar3;
      *(undefined4 *)((long)pTVar2 + lVar4 * 8 + -4) = 0xfffffffb;
    }
    return pGVar3;
  }
LAB_0013ef2a:
  lj_err_argt(L,narg,4);
}

Assistant:

GCstr *lj_lib_checkstr(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (LJ_LIKELY(tvisstr(o))) {
      return strV(o);
    } else if (tvisnumber(o)) {
      GCstr *s = lj_strfmt_number(L, o);
      setstrV(L, o, s);
      return s;
    }
  }
  lj_err_argt(L, narg, LUA_TSTRING);
  return NULL;  /* unreachable */
}